

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::v11::basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::
     grow(buffer<unsigned_int> *buf,size_t size)

{
  buffer<unsigned_int> *__src;
  uint *__dest;
  ulong uVar1;
  ulong n;
  
  uVar1 = (buf->capacity_ >> 1) + buf->capacity_;
  n = size;
  if (((size <= uVar1) && (n = uVar1, uVar1 >> 0x3e != 0)) &&
     (n = 0x3fffffffffffffff, 0x3fffffffffffffff < size)) {
    n = size;
  }
  __src = (buffer<unsigned_int> *)buf->ptr_;
  __dest = detail::allocator<unsigned_int>::allocate((allocator<unsigned_int> *)buf,n);
  memcpy(__dest,__src,buf->size_ << 2);
  buf->ptr_ = __dest;
  buf->capacity_ = n;
  if (__src == buf + 1) {
    return;
  }
  free(__src);
  return;
}

Assistant:

static FMT_CONSTEXPR20 void grow(detail::buffer<T>& buf, size_t size) {
    detail::abort_fuzzing_if(size > 5000);
    auto& self = static_cast<basic_memory_buffer&>(buf);
    const size_t max_size =
        std::allocator_traits<Allocator>::max_size(self.alloc_);
    size_t old_capacity = buf.capacity();
    size_t new_capacity = old_capacity + old_capacity / 2;
    if (size > new_capacity)
      new_capacity = size;
    else if (new_capacity > max_size)
      new_capacity = max_of(size, max_size);
    T* old_data = buf.data();
    T* new_data = self.alloc_.allocate(new_capacity);
    // Suppress a bogus -Wstringop-overflow in gcc 13.1 (#3481).
    detail::assume(buf.size() <= new_capacity);
    // The following code doesn't throw, so the raw pointer above doesn't leak.
    memcpy(new_data, old_data, buf.size() * sizeof(T));
    self.set(new_data, new_capacity);
    // deallocate must not throw according to the standard, but even if it does,
    // the buffer already uses the new storage and will deallocate it in
    // destructor.
    if (old_data != self.store_) self.alloc_.deallocate(old_data, old_capacity);
  }